

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChPhysicsItem.cpp
# Opt level: O2

shared_ptr<chrono::ChVisualShape> __thiscall
chrono::ChPhysicsItem::GetVisualShape(ChPhysicsItem *this,uint i)

{
  __shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined4 in_register_00000034;
  shared_ptr<chrono::ChVisualShape> sVar2;
  __shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  p_Var1 = *(__shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2> **)
            (CONCAT44(in_register_00000034,i) + 0x40);
  if (p_Var1 == (__shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (this->super_ChObj)._vptr_ChObj = (_func_int **)0x0;
    (this->super_ChObj).m_name._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    std::__shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_28,p_Var1);
    ChVisualModel::GetShape((ChVisualModel *)this,(uint)local_28._M_ptr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
    in_RDX._M_pi = extraout_RDX;
  }
  sVar2.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar2.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::ChVisualShape>)
         sVar2.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChVisualShape> ChPhysicsItem::GetVisualShape(unsigned int i) const {
    if (!vis_model_instance)
        return nullptr;
    return vis_model_instance->GetModel()->GetShape(i);
}